

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall double_conversion::Bignum::MultiplyByUInt64(Bignum *this,uint64_t factor)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (factor != 1) {
    if (factor == 0) {
      this->used_bigits_ = 0;
      this->exponent_ = 0;
      return;
    }
    uVar3 = (ulong)(ushort)this->used_bigits_;
    if ((uVar3 != 0) && (0 < this->used_bigits_)) {
      uVar5 = 0;
      uVar4 = 0;
      do {
        uVar1 = this->bigits_buffer_[uVar5];
        uVar6 = (ulong)((uint)uVar4 & 0xfffffff) + (factor & 0xffffffff) * (ulong)uVar1;
        this->bigits_buffer_[uVar5] = (uint)uVar6 & 0xfffffff;
        uVar4 = (uVar4 >> 0x1c) + (ulong)uVar1 * (factor >> 0x1c & 0xfffffffffffffff0) +
                (uVar6 >> 0x1c);
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
      if (uVar4 != 0) {
        do {
          if (0x7f < (short)uVar3) {
            abort();
          }
          this->bigits_buffer_[uVar3] = (uint)uVar4 & 0xfffffff;
          uVar3 = uVar3 + 1;
          this->used_bigits_ = (int16_t)uVar3;
          bVar2 = 0xfffffff < uVar4;
          uVar4 = uVar4 >> 0x1c;
        } while (bVar2);
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt64(const uint64_t factor) {
  if (factor == 1) {
    return;
  }
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_bigits_ == 0) {
    return;
  }
  DOUBLE_CONVERSION_ASSERT(kBigitSize < 32);
  uint64_t carry = 0;
  const uint64_t low = factor & 0xFFFFFFFF;
  const uint64_t high = factor >> 32;
  for (int i = 0; i < used_bigits_; ++i) {
    const uint64_t product_low = low * RawBigit(i);
    const uint64_t product_high = high * RawBigit(i);
    const uint64_t tmp = (carry & kBigitMask) + product_low;
    RawBigit(i) = tmp & kBigitMask;
    carry = (carry >> kBigitSize) + (tmp >> kBigitSize) +
        (product_high << (32 - kBigitSize));
  }
  while (carry != 0) {
    EnsureCapacity(used_bigits_ + 1);
    RawBigit(used_bigits_) = carry & kBigitMask;
    used_bigits_++;
    carry >>= kBigitSize;
  }
}